

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b)

{
  pointer __dest;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,(char)a->piece_size_ + (char)*(undefined8 *)(this + 8));
  __dest = (__return_storage_ptr__->_M_dataplus)._M_p;
  if (*(size_t *)(this + 8) != 0) {
    memcpy(__dest,*(void **)this,*(size_t *)(this + 8));
    __dest = __dest + *(long *)(this + 8);
  }
  if (a->piece_size_ != 0) {
    memcpy(__dest,a->piece_data_,a->piece_size_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StrCat(const AlphaNum &a, const AlphaNum &b) {
  std::string result;
  result.resize(a.size() + b.size());
  char *const begin = &*result.begin();
  char *out = Append2(begin, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}